

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_arccurve.cpp
# Opt level: O0

bool __thiscall ON_ArcCurve::Read(ON_ArcCurve *this,ON_BinaryArchive *file)

{
  bool local_21;
  int local_20;
  int iStack_1c;
  bool rc;
  int minor_version;
  int major_version;
  ON_BinaryArchive *file_local;
  ON_ArcCurve *this_local;
  
  iStack_1c = 0;
  local_20 = 0;
  _minor_version = file;
  file_local = (ON_BinaryArchive *)this;
  local_21 = ON_BinaryArchive::Read3dmChunkVersion(file,&stack0xffffffffffffffe4,&local_20);
  if (local_21) {
    if (iStack_1c == 1) {
      local_21 = ON_BinaryArchive::ReadArc(_minor_version,&this->m_arc);
      if (local_21) {
        local_21 = ON_BinaryArchive::ReadInterval(_minor_version,&this->m_t);
      }
      if (local_21 != false) {
        local_21 = ON_BinaryArchive::ReadInt(_minor_version,&this->m_dim);
      }
      if ((this->m_dim != 2) && (this->m_dim != 3)) {
        this->m_dim = 3;
      }
    }
    else {
      local_21 = false;
    }
  }
  return local_21;
}

Assistant:

bool ON_ArcCurve::Read(
       ON_BinaryArchive& file // open binary file
     )
{
  int major_version = 0;
  int minor_version = 0;
  bool rc = file.Read3dmChunkVersion(&major_version,&minor_version);
  if (rc)
  {
    if (major_version==1) 
    {
      // common to all 1.x  versions
      rc = file.ReadArc( m_arc );
      if (rc) 
        rc = file.ReadInterval( m_t );
      if (rc) 
        rc = file.ReadInt(&m_dim);
      if ( m_dim != 2 && m_dim != 3 )
        m_dim = 3;
    }
    else
      rc = 0;
  }
  return rc;
}